

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_class.c
# Opt level: O2

value class_static_call(klass cls,method m,void **args,size_t argc)

{
  class_impl_interface_static_invoke p_Var1;
  char *pcVar2;
  value pvVar3;
  char *pcVar4;
  
  if (((cls == (klass)0x0) || (cls->interface == (class_interface)0x0)) ||
     (p_Var1 = cls->interface->static_invoke,
     m == (method)0x0 || p_Var1 == (class_impl_interface_static_invoke)0x0)) {
    pvVar3 = (value)0x0;
  }
  else {
    pvVar3 = (*p_Var1)(cls,cls->impl,m,args,argc);
    if (pvVar3 == (value)0x0) {
      pcVar2 = cls->name;
      pcVar4 = method_name(m);
      pvVar3 = (value)0x0;
      log_write_impl_va("metacall",0x2fb,"class_static_call",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_class.c"
                        ,3,"Invalid class %s invoke of static method %s",pcVar2,pcVar4);
    }
  }
  return pvVar3;
}

Assistant:

value class_static_call(klass cls, method m, class_args args, size_t argc)
{
	if (cls != NULL && cls->interface != NULL && cls->interface->static_invoke != NULL && m != NULL)
	{
		value v = cls->interface->static_invoke(cls, cls->impl, m, args, argc);

		if (v == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid class %s invoke of static method %s", cls->name, method_name(m));

			return NULL;
		}

		return v;
	}

	return NULL;
}